

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O0

int String::compare(char *s1,char *s2)

{
  byte *local_20;
  char *s2_local;
  char *s1_local;
  
  local_20 = (byte *)s2;
  s2_local = s1;
  while( true ) {
    if (*s2_local != *local_20) {
      return (uint)(byte)*s2_local - (uint)*local_20;
    }
    if (*s2_local == '\0') break;
    s2_local = s2_local + 1;
    local_20 = local_20 + 1;
  }
  return 0;
}

Assistant:

static int compare(const char* s1, const char* s2)
  {
    for(; *s1 == *s2; ++s1, ++s2)
      if(!*s1)
        return 0;
    return (int)*(const uchar*)s1 - *(const uchar*)s2;
  }